

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O0

FT_Long FT_DivFix(FT_Long a_,FT_Long b_)

{
  undefined8 local_50;
  undefined8 local_48;
  FT_Long q_;
  FT_UInt64 q;
  FT_UInt64 b;
  FT_UInt64 a;
  FT_Int s;
  FT_Long b__local;
  FT_Long a__local;
  
  a._4_4_ = 1;
  b = a_;
  if (a_ < 0) {
    b = -a_;
    a._4_4_ = -1;
  }
  q = b_;
  if (b_ < 0) {
    q = -b_;
    a._4_4_ = -a._4_4_;
  }
  if (q == 0) {
    local_48 = 0x7fffffff;
  }
  else {
    local_48 = (b * 0x10000 + (q >> 1)) / q;
  }
  if (a._4_4_ < 0) {
    local_50 = -local_48;
  }
  else {
    local_50 = local_48;
  }
  return local_50;
}

Assistant:

FT_EXPORT_DEF( FT_Long )
  FT_DivFix( FT_Long  a_,
             FT_Long  b_ )
  {
    FT_Int     s = 1;
    FT_UInt64  a, b, q;
    FT_Long    q_;


    a = (FT_UInt64)a_;
    b = (FT_UInt64)b_;

    FT_MOVE_SIGN( a_, a, s );
    FT_MOVE_SIGN( b_, b, s );

    q = b > 0 ? ( ( a << 16 ) + ( b >> 1 ) ) / b
              : 0x7FFFFFFFUL;

    q_ = (FT_Long)q;

    return s < 0 ? NEG_LONG( q_ ) : q_;
  }